

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O1

unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> __thiscall
draco::PointCloud::CreateAttribute
          (PointCloud *this,GeometryAttribute *att,bool identity_mapping,
          ValueType num_attribute_values)

{
  uint uVar1;
  pointer pIVar2;
  PointAttribute *this_00;
  undefined7 in_register_00000011;
  pointer *__ptr;
  uint in_R8D;
  
  if (((GeometryAttribute *)CONCAT71(in_register_00000011,identity_mapping))->attribute_type_ ==
      INVALID) {
    this->_vptr_PointCloud = (_func_int **)0x0;
  }
  else {
    this_00 = (PointAttribute *)operator_new(0x70);
    PointAttribute::PointAttribute
              (this_00,(GeometryAttribute *)CONCAT71(in_register_00000011,identity_mapping));
    this->_vptr_PointCloud = (_func_int **)this_00;
    if ((char)num_attribute_values == '\0') {
      uVar1 = *(uint *)&att[2].normalized_;
      this_00->identity_mapping_ = false;
      std::
      vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ::resize(&(this_00->indices_map_).vector_,(ulong)uVar1,
               (value_type *)&kInvalidAttributeValueIndex);
    }
    else {
      this_00->identity_mapping_ = true;
      pIVar2 = (this_00->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this_00->indices_map_).vector_.
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
        (this_00->indices_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
      }
      if (in_R8D < *(uint *)&att[2].normalized_) {
        in_R8D = *(uint *)&att[2].normalized_;
      }
    }
    if (in_R8D != 0) {
      PointAttribute::Reset((PointAttribute *)this->_vptr_PointCloud,(ulong)in_R8D);
    }
  }
  return (__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
          )(__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PointAttribute> PointCloud::CreateAttribute(
    const GeometryAttribute &att, bool identity_mapping,
    AttributeValueIndex::ValueType num_attribute_values) const {
  if (att.attribute_type() == GeometryAttribute::INVALID) {
    return nullptr;
  }
  std::unique_ptr<PointAttribute> pa =
      std::unique_ptr<PointAttribute>(new PointAttribute(att));
  // Initialize point cloud specific attribute data.
  if (!identity_mapping) {
    // First create mapping between indices.
    pa->SetExplicitMapping(num_points_);
  } else {
    pa->SetIdentityMapping();
    num_attribute_values = std::max(num_points_, num_attribute_values);
  }
  if (num_attribute_values > 0) {
    pa->Reset(num_attribute_values);
  }
  return pa;
}